

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkSampleLocationsInfoEXT *info,ScratchAllocator *alloc)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  void *__dest;
  size_t size;
  
  puVar5 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar5 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)info;
    pvVar1 = info->pNext;
    uVar3 = *(undefined8 *)&info->sampleLocationsPerPixel;
    uVar4 = *(undefined8 *)&(info->sampleLocationGridSize).height;
    puVar5[4] = info->pSampleLocations;
    puVar5[2] = uVar3;
    puVar5[3] = uVar4;
    *puVar5 = uVar2;
    puVar5[1] = pvVar1;
  }
  if ((ulong)*(uint *)((long)puVar5 + 0x1c) != 0) {
    pvVar1 = (void *)puVar5[4];
    size = (ulong)*(uint *)((long)puVar5 + 0x1c) << 3;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_0012c9ba;
    }
  }
  __dest = (void *)0x0;
LAB_0012c9ba:
  puVar5[4] = __dest;
  return puVar5;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkSampleLocationsInfoEXT *info, ScratchAllocator &alloc)
{
	auto *loc = copy(info, 1, alloc);
	loc->pSampleLocations = copy(loc->pSampleLocations, loc->sampleLocationsCount, alloc);
	return loc;
}